

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.hxx
# Opt level: O1

void __thiscall
andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex::~Vertex
          (Vertex *this)

{
  pointer pAVar1;
  
  pAVar1 = (this->to_).vector_.
           super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar1 != (pointer)0x0) {
    operator_delete(pAVar1,(long)(this->to_).vector_.
                                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar1);
  }
  pAVar1 = (this->from_).vector_.
           super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar1 != (pointer)0x0) {
    operator_delete(pAVar1,(long)(this->from_).vector_.
                                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar1);
    return;
  }
  return;
}

Assistant:

Vertex()
            : from_(), to_()
            {}